

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,void *src,size_t srcSize,
                 ZSTD_dictTableLoadMethod_e dtlm)

{
  BYTE *iend;
  uint uVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  U32 UVar4;
  U32 UVar5;
  long lVar6;
  ulong uVar7;
  ulong extraout_RAX;
  undefined4 extraout_var;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  uint uVar8;
  
  iend = (BYTE *)((long)src + srcSize);
  pBVar2 = (ms->window).nextSrc;
  if (pBVar2 != (BYTE *)src) {
    pBVar3 = (ms->window).base;
    lVar6 = (long)pBVar2 - (long)pBVar3;
    UVar5 = (ms->window).dictLimit;
    (ms->window).lowLimit = UVar5;
    UVar4 = (U32)lVar6;
    (ms->window).dictLimit = UVar4;
    (ms->window).dictBase = pBVar3;
    (ms->window).base = (BYTE *)((long)src - lVar6);
    if (UVar4 - UVar5 < 8) {
      (ms->window).lowLimit = UVar4;
    }
  }
  (ms->window).nextSrc = iend;
  pBVar2 = (ms->window).dictBase;
  uVar1 = (ms->window).dictLimit;
  if (src < pBVar2 + uVar1 && pBVar2 + (ms->window).lowLimit < iend) {
    uVar8 = (uint)((long)iend - (long)pBVar2);
    if ((long)(ulong)uVar1 < (long)iend - (long)pBVar2) {
      uVar8 = uVar1;
    }
    (ms->window).lowLimit = uVar8;
  }
  uVar7 = 0;
  if (params->forceWindow == 0) {
    uVar7 = (ulong)(uint)((int)iend - *(int *)&(ms->window).base);
  }
  ms->loadedDictEnd = (U32)uVar7;
  if (8 < srcSize) {
    uVar7 = (ulong)((params->cParams).strategy - ZSTD_fast);
    switch(uVar7) {
    case 0:
      ZSTD_fillHashTable(ms,iend,dtlm);
      uVar7 = extraout_RAX_00;
      break;
    case 1:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm);
      uVar7 = extraout_RAX_01;
      break;
    case 2:
    case 3:
    case 4:
      UVar5 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
      uVar7 = CONCAT44(extraout_var,UVar5);
      break;
    case 5:
    case 6:
    case 7:
    case 8:
      ZSTD_updateTree(ms,iend + -8,iend);
      uVar7 = extraout_RAX;
    }
    ms->nextToUpdate = (int)iend - *(int *)&(ms->window).base;
  }
  return uVar7;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* const ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;

    ZSTD_window_update(&ms->window, src, srcSize);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);

    /* Assert that we the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    if (srcSize <= HASH_READ_SIZE) return 0;

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        if (srcSize >= HASH_READ_SIZE)
            ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}